

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O1

void Hop_ObjPrintVerilog(FILE *pFile,Hop_Obj_t *pObj,Vec_Vec_t *vLevels,int Level,int fOnlyAnds)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  void **ppvVar3;
  undefined8 *puVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  Hop_Obj_t *pHVar8;
  char *pcVar9;
  char *__s;
  int iVar10;
  Hop_Obj_t *pFanin1;
  Hop_Obj_t *pFanin0;
  byte local_54;
  Hop_Obj_t *local_40;
  Hop_Obj_t *local_38;
  
  uVar5 = (uint)pObj;
  pHVar8 = (Hop_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  uVar2 = *(uint *)&pHVar8->field_0x20 & 7;
  if (uVar2 == 2) {
    pcVar9 = "~";
    if (((ulong)pObj & 1) == 0) {
      pcVar9 = "";
    }
    fprintf((FILE *)pFile,"%s%s",pcVar9,(pHVar8->field_0).pData);
    return;
  }
  if (uVar2 == 1) {
    fprintf((FILE *)pFile,"1\'b%d",(ulong)(uVar5 & 1 ^ 1));
    return;
  }
  if (fOnlyAnds == 0) {
    if (uVar2 != 5) {
      iVar7 = Hop_ObjIsMuxType(pHVar8);
      if (iVar7 != 0) {
        iVar7 = Hop_ObjRecognizeExor(pHVar8,&local_38,&local_40);
        if (iVar7 == 0) {
          pHVar8 = Hop_ObjRecognizeMux(pHVar8,&local_40,&local_38);
          pcVar9 = "(";
          if (Level == 0) {
            pcVar9 = "";
          }
          __s = ")";
          if (Level == 0) {
            __s = "";
          }
          fputs(pcVar9,(FILE *)pFile);
          iVar7 = Level + 1;
          Hop_ObjPrintVerilog(pFile,pHVar8,vLevels,iVar7,0);
          fwrite(" ? ",3,1,(FILE *)pFile);
          Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)((ulong)local_40 ^ (ulong)(uVar5 & 1)),vLevels,
                              iVar7,0);
          fwrite(" : ",3,1,(FILE *)pFile);
          Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)((ulong)(uVar5 & 1) ^ (ulong)local_38),vLevels,
                              iVar7,0);
        }
        else {
          pcVar9 = "(";
          if (Level == 0) {
            pcVar9 = "";
          }
          __s = ")";
          if (Level == 0) {
            __s = "";
          }
          fputs(pcVar9,(FILE *)pFile);
          Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)((ulong)(uVar5 & 1) ^ (ulong)local_38),vLevels,
                              Level + 1,0);
          fwrite(" ^ ",3,1,(FILE *)pFile);
          Hop_ObjPrintVerilog(pFile,local_40,vLevels,Level + 1,0);
        }
        goto LAB_007f7468;
      }
      goto LAB_007f7019;
    }
    iVar7 = Level + 1;
    if (vLevels->nSize <= Level) {
      if (vLevels->nCap <= Level) {
        if (vLevels->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((long)iVar7 << 3);
        }
        else {
          ppvVar3 = (void **)realloc(vLevels->pArray,(long)iVar7 << 3);
        }
        vLevels->pArray = ppvVar3;
        vLevels->nCap = iVar7;
      }
      iVar10 = vLevels->nSize;
      lVar6 = (long)iVar10;
      if (iVar10 <= Level) {
        iVar10 = (Level - iVar10) + 1;
        do {
          puVar4 = (undefined8 *)malloc(0x10);
          *puVar4 = 0;
          puVar4[1] = 0;
          vLevels->pArray[lVar6] = puVar4;
          lVar6 = lVar6 + 1;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      vLevels->nSize = iVar7;
    }
    if ((Level < 0) || (vLevels->nSize <= Level)) goto LAB_007f747b;
    pVVar1 = (Vec_Ptr_t *)vLevels->pArray[(uint)Level];
    Hop_ObjCollectMulti(pHVar8,pVVar1);
    pcVar9 = "(";
    if (Level == 0) {
      pcVar9 = "";
    }
    fputs(pcVar9,(FILE *)pFile);
    if (0 < pVVar1->nSize) {
      lVar6 = 0;
      do {
        local_54 = (byte)(uVar5 & 1);
        Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)
                                  ((ulong)(lVar6 == 0 & local_54) ^ (ulong)pVVar1->pArray[lVar6]),
                            vLevels,iVar7,0);
        if (lVar6 < (long)pVVar1->nSize + -1) {
          fwrite(" ^ ",3,1,(FILE *)pFile);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar1->nSize);
    }
  }
  else {
LAB_007f7019:
    iVar7 = Level + 1;
    if (vLevels->nSize <= Level) {
      if (vLevels->nCap <= Level) {
        if (vLevels->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((long)iVar7 << 3);
        }
        else {
          ppvVar3 = (void **)realloc(vLevels->pArray,(long)iVar7 << 3);
        }
        vLevels->pArray = ppvVar3;
        vLevels->nCap = iVar7;
      }
      iVar10 = vLevels->nSize;
      lVar6 = (long)iVar10;
      if (iVar10 <= Level) {
        iVar10 = (Level - iVar10) + 1;
        do {
          puVar4 = (undefined8 *)malloc(0x10);
          *puVar4 = 0;
          puVar4[1] = 0;
          vLevels->pArray[lVar6] = puVar4;
          lVar6 = lVar6 + 1;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      vLevels->nSize = iVar7;
    }
    if ((Level < 0) || (vLevels->nSize <= Level)) {
LAB_007f747b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                    ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
    }
    pVVar1 = (Vec_Ptr_t *)vLevels->pArray[(uint)Level];
    Hop_ObjCollectMulti(pHVar8,pVVar1);
    pcVar9 = "(";
    if (Level == 0) {
      pcVar9 = "";
    }
    fputs(pcVar9,(FILE *)pFile);
    if (0 < pVVar1->nSize) {
      pcVar9 = "|";
      if (((ulong)pObj & 1) == 0) {
        pcVar9 = "&";
      }
      lVar6 = 0;
      do {
        Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)((ulong)pVVar1->pArray[lVar6] ^ (ulong)(uVar5 & 1)),
                            vLevels,iVar7,fOnlyAnds);
        if (lVar6 < (long)pVVar1->nSize + -1) {
          fprintf((FILE *)pFile," %s ",pcVar9);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar1->nSize);
    }
  }
  __s = ")";
  if (Level == 0) {
    __s = "";
  }
LAB_007f7468:
  fputs(__s,(FILE *)pFile);
  return;
}

Assistant:

void Hop_ObjPrintVerilog( FILE * pFile, Hop_Obj_t * pObj, Vec_Vec_t * vLevels, int Level, int fOnlyAnds )
{
    Vec_Ptr_t * vSuper;
    Hop_Obj_t * pFanin, * pFanin0, * pFanin1, * pFaninC;
    int fCompl, i;
    // store the complemented attribute
    fCompl = Hop_IsComplement(pObj);
    pObj = Hop_Regular(pObj);
    // constant case
    if ( Hop_ObjIsConst1(pObj) )
    {
        fprintf( pFile, "1\'b%d", !fCompl );
        return;
    }
    // PI case
    if ( Hop_ObjIsPi(pObj) )
    {
        fprintf( pFile, "%s%s", fCompl? "~" : "", (char*)pObj->pData );
        return;
    }
    // EXOR case
    if ( !fOnlyAnds && Hop_ObjIsExor(pObj) )
    {
        Vec_VecExpand( vLevels, Level );
        vSuper = Vec_VecEntry( vLevels, Level );
        Hop_ObjCollectMulti( pObj, vSuper );
        fprintf( pFile, "%s", (Level==0? "" : "(") );
        Vec_PtrForEachEntry( Hop_Obj_t *, vSuper, pFanin, i )
        {
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin, (fCompl && i==0)), vLevels, Level+1, fOnlyAnds );
            if ( i < Vec_PtrSize(vSuper) - 1 )
                fprintf( pFile, " ^ " );
        }
        fprintf( pFile, "%s", (Level==0? "" : ")") );
        return;
    }
    // MUX case
    if ( !fOnlyAnds && Hop_ObjIsMuxType(pObj) )
    {
        if ( Hop_ObjRecognizeExor( pObj, &pFanin0, &pFanin1 ) )
        {
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin0, fCompl), vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, " ^ " );
            Hop_ObjPrintVerilog( pFile, pFanin1, vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        else 
        {
            pFaninC = Hop_ObjRecognizeMux( pObj, &pFanin1, &pFanin0 );
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Hop_ObjPrintVerilog( pFile, pFaninC, vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, " ? " );
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin1, fCompl), vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, " : " );
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin0, fCompl), vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        return;
    }
    // AND case
    Vec_VecExpand( vLevels, Level );
    vSuper = Vec_VecEntry(vLevels, Level);
    Hop_ObjCollectMulti( pObj, vSuper );
    fprintf( pFile, "%s", (Level==0? "" : "(") );
    Vec_PtrForEachEntry( Hop_Obj_t *, vSuper, pFanin, i )
    {
        Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin, fCompl), vLevels, Level+1, fOnlyAnds );
        if ( i < Vec_PtrSize(vSuper) - 1 )
            fprintf( pFile, " %s ", fCompl? "|" : "&" );
    }
    fprintf( pFile, "%s", (Level==0? "" : ")") );
    return;
}